

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm_vecsmall::SmallVectorTemplateBase<Command::Arg,_false>::grow
          (SmallVectorTemplateBase<Command::Arg,_false> *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  undefined1 *__ptr;
  uint64_t uVar3;
  Arg *__result;
  
  pvVar1 = (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX;
  pvVar2 = (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.EndX;
  uVar3 = detail::NextPowerOf2
                    (((long)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).
                            super_SmallVectorBase.CapacityX - (long)pvVar1 >> 5) + 2);
  if (MinSize < uVar3) {
    MinSize = uVar3;
  }
  __result = (Arg *)malloc(MinSize * 0x20);
  std::__uninitialized_copy<false>::__uninit_copy<std::move_iterator<Command::Arg*>,Command::Arg*>
            ((Arg *)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).
                    super_SmallVectorBase.BeginX,
             (Arg *)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).
                    super_SmallVectorBase.EndX,__result);
  destroy_range((Arg *)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).
                       super_SmallVectorBase.BeginX,
                (Arg *)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).
                       super_SmallVectorBase.EndX);
  __ptr = (undefined1 *)
          (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX;
  if ((U *)__ptr != &(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).FirstEl) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.EndX =
       (void *)(((long)pvVar2 - (long)pvVar1) + (long)__result);
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX =
       __result;
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.CapacityX =
       __result + MinSize;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(llvm_vecsmall::detail::NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}